

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void gc(Vm *vm)

{
  Vm *vm_local;
  
  mark_all(vm);
  sweep(vm);
  vm->max_alloc_mem = vm->allocated_mem << 1;
  return;
}

Assistant:

void gc(Vm *vm) {
#if DEBUG_TRACE_GC
    size_t mem_before = vm->allocated_mem;
#endif

#if DISABLE_GC
    return;
#endif

    mark_all(vm);
    sweep(vm);

    vm->max_alloc_mem = vm->allocated_mem * 2;

#if DEBUG_TRACE_GC
    printf("Collected %ld bytes, %ld remaining.\n", mem_before - vm->allocated_mem, vm->allocated_mem);
#endif
}